

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O0

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxMaterial[]>(mmd *this,size_t n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  size_t *psVar3;
  PmxMaterial *__p;
  ulong uVar4;
  PmxMaterial *local_60;
  size_t n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar2 = SUB168(auVar1 * ZEXT816(0xc0),0);
  uVar4 = uVar2 + 8;
  if (SUB168(auVar1 * ZEXT816(0xc0),8) != 0 || 0xfffffffffffffff7 < uVar2) {
    uVar4 = 0xffffffffffffffff;
  }
  psVar3 = (size_t *)operator_new__(uVar4);
  *psVar3 = n;
  __p = (PmxMaterial *)(psVar3 + 1);
  if (n != 0) {
    local_60 = __p;
    do {
      pmx::PmxMaterial::PmxMaterial(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != __p + n);
  }
  std::unique_ptr<pmx::PmxMaterial[],std::default_delete<pmx::PmxMaterial[]>>::
  unique_ptr<pmx::PmxMaterial*,std::default_delete<pmx::PmxMaterial[]>,void,bool>
            ((unique_ptr<pmx::PmxMaterial[],std::default_delete<pmx::PmxMaterial[]>> *)this,__p);
  return (__uniq_ptr_data<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>,_true,_true>)
         (__uniq_ptr_data<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>,_true,_true>)
         this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }